

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O0

void __thiscall MyProgress::enditer(MyProgress *this,Graph *param_2,Float mincost,Float cost)

{
  ostream *poVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  string local_40 [36];
  int local_1c;
  float local_18;
  float local_14;
  
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  poVar1 = std::operator<<((ostream *)&std::cerr,"f = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::fixed);
  local_1c = (int)std::setprecision(6);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_1c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,"/");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1,"  ");
  now_abi_cxx11_();
  std::operator<<(poVar1,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void enditer(const Graph*, Float mincost, Float cost) const
  {
    std::cerr << "f = " << std::fixed << std::setprecision(6) << cost << "/" << mincost << "  " << now();
  }